

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void __thiscall
CVmObjTable::init_entry_for_alloc
          (CVmObjTable *this,vm_obj_id_t id,CVmObjPageEntry *entry,int in_root_set,int can_have_refs
          ,int can_have_weak_refs)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar1 = (ushort)((can_have_refs & 1U) << 9);
  uVar2 = ((ushort)can_have_weak_refs & 1) * 0x400 + ((ushort)in_root_set & 1) * 2 |
          (ushort)*(undefined4 *)&entry->field_0x14 & 0xf800 | uVar1;
  *(ushort *)&entry->field_0x14 = uVar2;
  if (in_root_set != 0) {
    if (uVar1 != 0) {
      entry->next_obj_ = this->gc_queue_head_;
      this->gc_queue_head_ = id;
      uVar2 = *(ushort *)&entry->field_0x14;
    }
    *(ushort *)&entry->field_0x14 = uVar2 & 0xfff3 | 8;
  }
  return;
}

Assistant:

void CVmObjTable::init_entry_for_alloc(vm_obj_id_t id,
                                       CVmObjPageEntry *entry,
                                       int in_root_set,
                                       int can_have_refs,
                                       int can_have_weak_refs)
{
    /* mark the entry as in use */
    entry->free_ = FALSE;

    /* no undo savepoint has been created since the object was created */
    entry->in_undo_ = FALSE;

    /* mark the object as being in the root set if appropriate */
    entry->in_root_set_ = in_root_set;

    /* presume it's an ordinary persistent object */
    entry->transient_ = FALSE;

    /* presume it won't need post-load initialization */
    entry->requested_post_load_init_ = FALSE;

    /* set the GC characteristics as requested */
    entry->can_have_refs_ = can_have_refs;
    entry->can_have_weak_refs_ = can_have_weak_refs;

    /* 
     *   Mark the object as initially unreachable and unfinalizable.  It's
     *   not necessarily really unreachable at this point, but we mark it
     *   as such because the garbage collector hasn't explicitly traced
     *   the object to be reachable.  The initial conditions for garbage
     *   collection are that all objects not in the root set and not
     *   finalizable are marked as unreachable; since we're not in a gc
     *   pass right now (we can't be - memory cannot be allocated during a
     *   gc pass), we know that we must establish initial gc conditions
     *   for the next time we start a gc pass.  
     */
    entry->reachable_ = VMOBJ_UNREACHABLE;
    entry->finalize_state_ = VMOBJ_UNFINALIZABLE;

    /* add it to the GC work queue for the next GC pass */
    if (in_root_set)
        add_to_gc_queue(id, entry, VMOBJ_REACHABLE);
}